

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_211787::AlsaPlayback::open(AlsaPlayback *this,char *__file,int __oflag,...)

{
  anon_class_8_1_898f2789_for__M_pred __pred;
  bool bVar1;
  int iVar2;
  backend_exception *pbVar3;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  int err;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  iter;
  char *driver;
  snd_pcm_stream_t in_stack_0000042c;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  *in_stack_ffffffffffffff80;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  local_38 [4];
  char *local_18;
  char *local_10;
  AlsaPlayback *local_8;
  
  local_18 = (char *)0x0;
  local_8 = this;
  if (__file == (char *)0x0) {
    local_10 = "ALSA Default";
    local_18 = GetConfigValue(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  else {
    local_10 = __file;
    bVar1 = std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::empty((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                     *)this);
    if (bVar1) {
      probe_devices(in_stack_0000042c);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::operator=((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                   *)this,in_stack_ffffffffffffff88);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::~vector((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                 *)this);
    }
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cbegin(in_stack_ffffffffffffff78);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cend(in_stack_ffffffffffffff78);
    __pred.name._4_4_ = in_stack_ffffffffffffff9c;
    __pred.name._0_4_ = in_stack_ffffffffffffff98;
    local_38[0] = std::
                  find_if<__gnu_cxx::__normal_iterator<(anonymous_namespace)::DevMap_const*,std::vector<(anonymous_namespace)::DevMap,al::allocator<(anonymous_namespace)::DevMap,8ul>>>,(anonymous_namespace)::AlsaPlayback::open(char_const*)::__0>
                            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,__pred);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cend(in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator==
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
                        *)in_stack_ffffffffffffff78);
    if (bVar1) {
      pbVar3 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception
                (pbVar3,0xa004,"Device name \"%s\" not found",local_10);
      __cxa_throw(pbVar3,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
    __gnu_cxx::
    __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
    ::operator->(local_38);
    local_18 = (char *)std::__cxx11::string::c_str();
  }
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Opening device \"%s\"\n",local_18);
  }
  iVar2 = (*(anonymous_namespace)::psnd_pcm_open)(&this->mPcmHandle,local_18,0,1);
  if (-1 < iVar2) {
    (*(anonymous_namespace)::psnd_config_update_free_global)();
    iVar2 = std::__cxx11::string::operator=
                      ((string *)&((this->super_BackendBase).mDevice)->DeviceName,local_10);
    return iVar2;
  }
  pbVar3 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception
            (pbVar3,0xa005,"Could not open ALSA device \"%s\"",local_18);
  __cxa_throw(pbVar3,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
}

Assistant:

void AlsaPlayback::open(const ALCchar *name)
{
    const char *driver{};
    if(name)
    {
        if(PlaybackDevices.empty())
            PlaybackDevices = probe_devices(SND_PCM_STREAM_PLAYBACK);

        auto iter = std::find_if(PlaybackDevices.cbegin(), PlaybackDevices.cend(),
            [name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == PlaybackDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        driver = iter->device_name.c_str();
    }
    else
    {
        name = alsaDevice;
        driver = GetConfigValue(nullptr, "alsa", "device", "default");
    }

    TRACE("Opening device \"%s\"\n", driver);
    int err{snd_pcm_open(&mPcmHandle, driver, SND_PCM_STREAM_PLAYBACK, SND_PCM_NONBLOCK)};
    if(err < 0)
        throw al::backend_exception{ALC_OUT_OF_MEMORY, "Could not open ALSA device \"%s\"",
            driver};

    /* Free alsa's global config tree. Otherwise valgrind reports a ton of leaks. */
    snd_config_update_free_global();

    mDevice->DeviceName = name;
}